

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorInfo.hpp
# Opt level: O0

void __thiscall
helics::TranslatorInfo::TranslatorInfo
          (TranslatorInfo *this,GlobalHandle handle,string_view key_,string_view endpointType,
          string_view units)

{
  string_view type_;
  string_view type__00;
  string_view key__00;
  string_view ptype;
  string_view key__01;
  string_view pkey;
  string_view units_;
  string_view punits;
  EndpointInfo *this_00;
  GlobalHandle in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  allocator<char> *in_RDI;
  char *in_R8;
  size_t in_R9;
  size_t in_stack_00000010;
  char *in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  InputInfo *in_stack_ffffffffffffff08;
  size_t in_stack_ffffffffffffff10;
  PublicationInfo *in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  GlobalHandle in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  GlobalHandle in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined1 local_31 [33];
  GlobalHandle GStack_10;
  
  *(undefined8 *)in_RDI = in_RSI;
  this_00 = (EndpointInfo *)(in_RDI + 8);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_31;
  local_31._9_8_ = in_R8;
  local_31._17_8_ = in_R9;
  local_31._25_8_ = in_RDX;
  GStack_10 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (this_01,(basic_string_view<char,_std::char_traits<char>_> *)this_00,in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  *(undefined2 *)(in_RDI + 0x28) = 0;
  std::shared_ptr<helics::TranslatorOperator>::shared_ptr
            ((shared_ptr<helics::TranslatorOperator> *)0x5bb676);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  pkey._M_str = in_stack_ffffffffffffff38;
  pkey._M_len._0_4_ = in_stack_ffffffffffffff30.fed_id.gid;
  pkey._M_len._4_4_ = in_stack_ffffffffffffff30.handle.hid;
  ptype._M_str = in_stack_ffffffffffffff28;
  ptype._M_len = in_stack_ffffffffffffff20;
  punits._M_str = in_stack_ffffffffffffff58;
  punits._M_len = in_stack_ffffffffffffff50;
  PublicationInfo::PublicationInfo
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff40,pkey,ptype,punits);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 0x158),
             in_stack_fffffffffffffec8);
  key__01._M_str = in_stack_ffffffffffffff28;
  key__01._M_len = in_stack_ffffffffffffff20;
  type__00._M_str = (char *)in_stack_ffffffffffffff18;
  type__00._M_len = in_stack_ffffffffffffff10;
  units_._M_str = in_stack_ffffffffffffff48;
  units_._M_len = in_stack_00000010;
  InputInfo::InputInfo(in_stack_ffffffffffffff08,in_stack_ffffffffffffff30,key__01,type__00,units_);
  key__00._M_str = (char *)local_31._25_8_;
  key__00._M_len = local_31._17_8_;
  type_._M_str = (char *)local_31._9_8_;
  type_._M_len = (size_t)this_01;
  EndpointInfo::EndpointInfo(this_00,GStack_10,key__00,type_);
  return;
}

Assistant:

TranslatorInfo(GlobalHandle handle,
                   std::string_view key_,
                   std::string_view endpointType,
                   std::string_view units):
        id(handle), key(key_), pub(handle, key_, "any", units), ipt(handle, key_, "any", units),
        ept(handle, key_, endpointType)
    {
    }